

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void lengthFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  int iVar2;
  undefined8 *in_RDX;
  undefined8 in_RDI;
  int iVal;
  uchar c;
  uchar *z0;
  uchar *z;
  undefined8 in_stack_ffffffffffffffc8;
  int iVal_00;
  undefined4 in_stack_ffffffffffffffd4;
  byte *local_20;
  
  iVal = (int)((ulong)in_RDI >> 0x20);
  iVal_00 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  iVar2 = sqlite3_value_type((sqlite3_value *)*in_RDX);
  if (1 < iVar2 - 1U) {
    if (iVar2 == 3) {
      local_20 = sqlite3_value_text((sqlite3_value *)0x1db80d);
      if (local_20 == (byte *)0x0) {
        return;
      }
      while( true ) {
        bVar1 = *local_20;
        in_stack_ffffffffffffffd4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd4);
        if (bVar1 == 0) break;
        local_20 = local_20 + 1;
        if (0xbf < bVar1) {
          for (; (*local_20 & 0xc0) == 0x80; local_20 = local_20 + 1) {
          }
        }
      }
      sqlite3_result_int((sqlite3_context *)CONCAT44(in_stack_ffffffffffffffd4,iVar2),iVal_00);
      return;
    }
    if (iVar2 != 4) {
      sqlite3_result_null((sqlite3_context *)0x1db8b3);
      return;
    }
  }
  sqlite3_value_bytes((sqlite3_value *)0x1db7f0);
  sqlite3_result_int((sqlite3_context *)CONCAT44(in_stack_ffffffffffffffd4,iVar2),iVal);
  return;
}

Assistant:

static void lengthFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_BLOB:
    case SQLITE_INTEGER:
    case SQLITE_FLOAT: {
      sqlite3_result_int(context, sqlite3_value_bytes(argv[0]));
      break;
    }
    case SQLITE_TEXT: {
      const unsigned char *z = sqlite3_value_text(argv[0]);
      const unsigned char *z0;
      unsigned char c;
      if( z==0 ) return;
      z0 = z;
      while( (c = *z)!=0 ){
        z++;
        if( c>=0xc0 ){
          while( (*z & 0xc0)==0x80 ){ z++; z0++; }
        }
      }
      sqlite3_result_int(context, (int)(z-z0));
      break;
    }
    default: {
      sqlite3_result_null(context);
      break;
    }
  }
}